

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

shared_ptr<Access> __thiscall Parser::offset(Parser *this,shared_ptr<Id> *a)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_ptr_access<Id,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Access> sVar4;
  shared_ptr<Expr> local_160;
  shared_ptr<Arith> local_150;
  undefined1 local_139;
  shared_ptr<Expr> local_138;
  shared_ptr<Arith> local_128;
  shared_ptr<Constant> local_118;
  __shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> local_108 [16];
  Parser local_f8;
  shared_ptr<Constant> local_c0;
  __shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> local_b0 [16];
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  shared_ptr<Type> type;
  shared_ptr<Expr> loc;
  shared_ptr<Expr> t2;
  shared_ptr<Expr> t1;
  shared_ptr<Expr> w;
  shared_ptr<Expr> i;
  shared_ptr<Id> *a_local;
  Parser *this_local;
  
  std::shared_ptr<Expr>::shared_ptr
            ((shared_ptr<Expr> *)&w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<Expr>::shared_ptr
            ((shared_ptr<Expr> *)
             &t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Expr>::shared_ptr
            ((shared_ptr<Expr> *)
             &t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Expr>::shared_ptr
            ((shared_ptr<Expr> *)
             &loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Expr>::shared_ptr
            ((shared_ptr<Expr> *)
             &type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<Id,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (in_RDX);
  std::shared_ptr<Type>::shared_ptr((shared_ptr<Type> *)local_80,&(peVar1->super_Expr).type);
  match((Parser *)a,0x5b);
  boolean((Parser *)local_a0);
  std::shared_ptr<Expr>::operator=
            ((shared_ptr<Expr> *)&w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(shared_ptr<Expr> *)local_a0);
  std::shared_ptr<Expr>::~shared_ptr((shared_ptr<Expr> *)local_a0);
  match((Parser *)a,0x5d);
  std::dynamic_pointer_cast<Array,Type>((shared_ptr<Type> *)local_b0);
  peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (local_b0);
  std::shared_ptr<Type>::operator=((shared_ptr<Type> *)local_80,&peVar2->of);
  std::shared_ptr<Array>::~shared_ptr((shared_ptr<Array> *)local_b0);
  std::__shared_ptr_access<Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_80);
  std::make_shared<Constant,int&>((int *)&local_c0);
  std::shared_ptr<Expr>::operator=
            ((shared_ptr<Expr> *)
             &t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_c0);
  std::shared_ptr<Constant>::~shared_ptr(&local_c0);
  local_f8._23_1_ = 0x2a;
  std::make_shared<Token,char>((char *)&local_f8.lex);
  std::make_shared<Arith,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
            (&local_f8.look,(shared_ptr<Expr> *)&local_f8.lex,
             (shared_ptr<Expr> *)&w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<Expr>::operator=
            ((shared_ptr<Expr> *)
             &t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<Arith> *)&local_f8.look);
  std::shared_ptr<Arith>::~shared_ptr((shared_ptr<Arith> *)&local_f8.look);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&local_f8.lex);
  std::shared_ptr<Expr>::operator=
            ((shared_ptr<Expr> *)
             &type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<Expr> *)
             &t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  while( true ) {
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &a[2].super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (peVar3->tag != 0x5b) break;
    match((Parser *)a,0x5b);
    boolean(&local_f8);
    std::shared_ptr<Expr>::operator=
              ((shared_ptr<Expr> *)
               &w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<Expr> *)&local_f8);
    std::shared_ptr<Expr>::~shared_ptr((shared_ptr<Expr> *)&local_f8);
    match((Parser *)a,0x5d);
    std::dynamic_pointer_cast<Array,Type>((shared_ptr<Type> *)local_108);
    peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (local_108);
    std::shared_ptr<Type>::operator=((shared_ptr<Type> *)local_80,&peVar2->of);
    std::shared_ptr<Array>::~shared_ptr((shared_ptr<Array> *)local_108);
    std::__shared_ptr_access<Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_80);
    std::make_shared<Constant,int&>((int *)&local_118);
    std::shared_ptr<Expr>::operator=
              ((shared_ptr<Expr> *)
               &t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_118);
    std::shared_ptr<Constant>::~shared_ptr(&local_118);
    local_139 = 0x2a;
    std::make_shared<Token,char>((char *)&local_138);
    std::make_shared<Arith,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
              ((shared_ptr<Token> *)&local_128,&local_138,
               (shared_ptr<Expr> *)
               &w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Expr>::operator=
              ((shared_ptr<Expr> *)
               &t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_128);
    std::shared_ptr<Arith>::~shared_ptr(&local_128);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&local_138);
    std::make_shared<Token,char>((char *)&local_160);
    std::make_shared<Arith,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
              ((shared_ptr<Token> *)&local_150,&local_160,
               (shared_ptr<Expr> *)
               &type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Expr>::operator=
              ((shared_ptr<Expr> *)
               &loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_150);
    std::shared_ptr<Arith>::~shared_ptr(&local_150);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&local_160);
    std::shared_ptr<Expr>::operator=
              ((shared_ptr<Expr> *)
               &type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<Expr> *)
               &loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::make_shared<Access,std::shared_ptr<Id>&,std::shared_ptr<Expr>&,std::shared_ptr<Type>&>
            ((shared_ptr<Id> *)this,(shared_ptr<Expr> *)in_RDX,
             (shared_ptr<Type> *)
             &type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Type>::~shared_ptr((shared_ptr<Type> *)local_80);
  std::shared_ptr<Expr>::~shared_ptr
            ((shared_ptr<Expr> *)
             &type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Expr>::~shared_ptr
            ((shared_ptr<Expr> *)
             &loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Expr>::~shared_ptr
            ((shared_ptr<Expr> *)
             &t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Expr>::~shared_ptr
            ((shared_ptr<Expr> *)
             &t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Expr>::~shared_ptr
            ((shared_ptr<Expr> *)&w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Access>)sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Access> offset(std::shared_ptr<Id> a) {
		std::shared_ptr<Expr> i, w, t1, t2, loc;
		std::shared_ptr<Type> type = a->type;
		match('['); i = boolean(); match(']');
		type = (std::dynamic_pointer_cast<Array>(type))->of;
		w = std::make_shared<Constant>(type->width);
		t1 = std::make_shared<Arith>(std::make_shared<Token>('*'), i, w);
		loc = t1;
		while (look->tag == '[') {
			match('['); i = boolean(); match(']');
			type = (std::dynamic_pointer_cast<Array>(type))->of;
			w = std::make_shared<Constant>(type->width);
			t1 = std::make_shared<Arith>(std::make_shared<Token>('*'), i, w);
			t2 = std::make_shared<Arith>(std::make_shared<Token>('+'), loc, t1);
			loc = t2;
		}
		return std::make_shared<Access>(a, loc, type);
	}